

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Server::Server(Server *this,IPAddress *addr,uint16_t port)

{
  impl_ *this_00;
  int local_20;
  uint16_t local_1a;
  IPAddress *pIStack_18;
  uint16_t port_local;
  IPAddress *addr_local;
  Server *this_local;
  
  this->_vptr_Server = (_func_int **)&PTR_ClientFactory_002c5bc0;
  local_1a = port;
  pIStack_18 = addr;
  addr_local = (IPAddress *)this;
  this_00 = (impl_ *)operator_new(0x188);
  local_20 = socket(2,1,0);
  impl_::impl_(this_00,&local_20);
  this->impl = this_00;
  IPAddress::IPAddress(&this->address);
  this->state = Created;
  this->recv_buffer_max = 0x8000;
  this->send_buffer_max = 0x8000;
  this->maxconn = 0;
  std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::list(&this->clients);
  Bind(this,pIStack_18,local_1a);
  return;
}

Assistant:

Server::Server(const IPAddress &addr, uint16_t port)
	: impl(new impl_(socket(AF_INET, SOCK_STREAM, 0)))
	, state(Created)
	, recv_buffer_max(32 * 1024)
	, send_buffer_max(32 * 1024)
	, maxconn(0)
{
	this->Bind(addr, port);
}